

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

string_type * __thiscall
parser::state::string_abi_cxx11_(string_type *__return_storage_ptr__,state *this,posn *p,ind n)

{
  range_type iters;
  allocator<char> local_99;
  _Deque_iterator<char,_char_&,_char_*> local_98;
  _Deque_iterator<char,_char_&,_char_*> local_78;
  range_type local_58;
  
  range(&local_58,this,p,n);
  local_78._M_cur = local_58.first._M_cur;
  local_78._M_first = local_58.first._M_first;
  local_78._M_last = local_58.first._M_last;
  local_78._M_node = local_58.first._M_node;
  local_98._M_cur = local_58.second._M_cur;
  local_98._M_first = local_58.second._M_first;
  local_98._M_last = local_58.second._M_last;
  local_98._M_node = local_58.second._M_node;
  std::__cxx11::string::string<std::_Deque_iterator<char,char&,char*>,void>
            ((string *)__return_storage_ptr__,&local_78,&local_98,&local_99);
  return __return_storage_ptr__;
}

Assistant:

string_type string(const struct posn& p, ind n) {
			range_type iters = range(p, n);
			return string_type(iters.first, iters.second);
		}